

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           *this,int value)

{
  wchar_t wVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  size_t sVar8;
  wchar_t wVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  wchar_t local_18 [4];
  
  uVar6 = (ulong)(uint)-value;
  if (0 < value) {
    uVar6 = (ulong)(uint)value;
  }
  uVar4 = (uint)uVar6;
  uVar2 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar2 = (uVar2 - (uVar4 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar2 * 4))) + 1;
  uVar3 = (ulong)uVar2;
  if (value < 0) {
    pwVar7 = (this->out_).super_truncating_iterator_base<wchar_t_*>.out_;
    uVar11 = (this->out_).super_truncating_iterator_base<wchar_t_*>.count_;
    (this->out_).super_truncating_iterator_base<wchar_t_*>.count_ = uVar11 + 1;
    if (uVar11 < (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_) {
      (this->out_).super_truncating_iterator_base<wchar_t_*>.out_ = pwVar7 + 1;
    }
    else {
      pwVar7 = local_18;
    }
    *pwVar7 = L'-';
  }
  lVar10 = (long)local_18 + uVar3;
  if (99 < uVar4) {
    do {
      uVar5 = (uint)uVar6;
      uVar4 = (uint)(uVar6 / 100);
      uVar6 = uVar6 / 100;
      *(undefined2 *)(lVar10 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar5 + (int)uVar6 * -100) * 2);
      lVar10 = lVar10 + -2;
    } while (9999 < uVar5);
  }
  pwVar7 = (this->out_).super_truncating_iterator_base<wchar_t_*>.out_;
  uVar6 = (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_;
  sVar8 = (this->out_).super_truncating_iterator_base<wchar_t_*>.count_;
  wVar9 = (this->out_).blackhole_;
  if (uVar4 < 10) {
    bVar12 = (byte)uVar4 | 0x30;
    lVar13 = -1;
  }
  else {
    *(undefined1 *)(lVar10 + -1) =
         internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1];
    bVar12 = internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
    lVar13 = -2;
  }
  *(byte *)(lVar10 + lVar13) = bVar12;
  if (0 < (int)uVar2) {
    uVar11 = 0;
    do {
      wVar1 = (int)*(char *)((long)local_18 + uVar11);
      if (sVar8 + uVar11 < uVar6) {
        *pwVar7 = (int)*(char *)((long)local_18 + uVar11);
        pwVar7 = pwVar7 + 1;
        wVar1 = wVar9;
      }
      wVar9 = wVar1;
      uVar11 = uVar11 + 1;
    } while (uVar3 != uVar11);
    sVar8 = sVar8 + uVar3;
  }
  (this->out_).super_truncating_iterator_base<wchar_t_*>.out_ = pwVar7;
  (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_ = uVar6;
  (this->out_).super_truncating_iterator_base<wchar_t_*>.count_ = sVar8;
  (this->out_).blackhole_ = wVar9;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }